

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

bool __thiscall
stream::slice_reader::open_file_case_insensitive
          (slice_reader *this,path_type *dirname,path_type *filename)

{
  undefined1 uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Test;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *Loc;
  void *in_RDX;
  path_type actual_filename;
  directory_iterator i;
  directory_iterator end;
  path_type *in_stack_00000660;
  slice_reader *in_stack_00000668;
  undefined5 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar4;
  byte bVar5;
  locale *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  directory_options in_stack_ffffffffffffff44;
  path *in_stack_ffffffffffffff48;
  directory_iterator *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff60;
  locale local_68 [8];
  undefined1 local_60 [32];
  uint local_40;
  undefined1 local_28 [40];
  
  local_28._8_8_ = in_RDX;
  boost::filesystem::directory_iterator::directory_iterator((bitset<3UL> *)0x1b7499);
  boost::filesystem::directory_iterator::directory_iterator
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  while( true ) {
    ppVar3 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_28;
    uVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)in_stack_ffffffffffffff38);
    if (!(bool)uVar1) break;
    Test = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           boost::iterators::detail::
           iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
           ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                         *)0x1b7528);
    ppVar3 = std::__niter_base<std::pair<bool,std::__cxx11::string>*>(Test,ppVar3);
    boost::filesystem::path::filename();
    Loc = std::__niter_base<std::pair<bool,std::__cxx11::string>*>(local_60,ppVar3);
    std::__niter_base<std::pair<bool,std::__cxx11::string>*>((void *)local_28._8_8_,ppVar3);
    in_stack_ffffffffffffff38 = local_68;
    std::locale::locale(in_stack_ffffffffffffff38);
    bVar2 = boost::algorithm::iequals<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffff60),Test,(locale *)Loc);
    in_stack_ffffffffffffff44 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff44);
    bVar4 = 0;
    bVar5 = bVar4;
    if (bVar2) {
      boost::filesystem::operator/((path *)Test,(path *)Loc);
      bVar4 = open_file(in_stack_00000668,in_stack_00000660);
      in_stack_ffffffffffffff36 = bVar4;
      bVar5 = bVar4;
      std::_Destroy<std::__cxx11::string>((path *)0x1b7604);
    }
    std::locale::~locale(local_68);
    bVar2 = (bVar4 & 1) != 0;
    if (bVar2) {
      local_28[0x27] = 1;
    }
    local_40 = (uint)bVar2;
    std::_Destroy<std::__cxx11::string>((path *)0x1b76a6);
    if (local_40 != 0) goto LAB_001b76d5;
    boost::iterators::detail::
    iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                  *)CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff36,
                                            CONCAT15(bVar4,in_stack_ffffffffffffff30))));
  }
  local_40 = 2;
LAB_001b76d5:
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)0x1b76e2);
  if (local_40 == 2) {
    local_28[0x27] = 0;
    local_40 = 1;
  }
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)0x1b771f);
  return (bool)(local_28[0x27] & 1);
}

Assistant:

bool slice_reader::open_file_case_insensitive(const path_type & dirname, const path_type & filename) {
	
	boost::filesystem::directory_iterator end;
	for(boost::filesystem::directory_iterator i(dirname); i != end; ++i) {
		path_type actual_filename = i->path().filename();
		if(boost::iequals(actual_filename.string(), filename.string()) && open_file(dirname / actual_filename)) {
			return true;
		}
	}
	
	return false;
}